

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

logical pnga_locate_region(Integer g_a,Integer *lo,Integer *hi,Integer *map,Integer *proclist,
                          Integer *np)

{
  char *pcVar1;
  ushort uVar2;
  int iVar3;
  C_Integer *pCVar4;
  bool bVar5;
  bool bVar6;
  global_array_t *pgVar7;
  ushort uVar8;
  Integer _i;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  C_Integer CVar14;
  uint uVar15;
  int iVar16;
  long lVar17;
  C_Integer CVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  Integer *pIVar22;
  long *plVar23;
  long lVar24;
  Integer proc;
  long lVar25;
  uint uVar26;
  uint uVar27;
  long lVar28;
  ulong uVar29;
  long local_260;
  Integer *local_258;
  int proc_subscript [7];
  int procT [7];
  Integer max [7];
  int procB [7];
  int _index [7];
  char err_string [256];
  
  lVar28 = g_a + 1000;
  if ((g_a < -1000) || (_max_global_array <= lVar28)) {
    sprintf(err_string,"%s: INVALID ARRAY HANDLE","nga_locate_region");
    pnga_error(err_string,g_a);
  }
  if (GA[lVar28].actv == 0) {
    sprintf(err_string,"%s: ARRAY NOT ACTIVE","nga_locate_region");
    pnga_error(err_string,g_a);
  }
  pgVar7 = GA;
  uVar2 = GA[lVar28].ndim;
  lVar19 = (long)(short)uVar2;
  lVar20 = 0;
  if (0 < lVar19) {
    lVar20 = lVar19;
  }
  lVar9 = 0;
  while (lVar20 != lVar9) {
    if (lo[lVar9] < 1) {
      return 0;
    }
    plVar23 = hi + lVar9;
    if (*plVar23 < lo[lVar9]) {
      return 0;
    }
    pCVar4 = GA[lVar28].dims + lVar9;
    lVar9 = lVar9 + 1;
    if (*pCVar4 < *plVar23) {
      return 0;
    }
  }
  switch(GA[lVar28].distr_type) {
  case 0:
    lVar9 = 0;
    lVar13 = 0;
LAB_00166877:
    if (lVar13 != lVar20) {
      lVar11 = lo[lVar13];
      pCVar4 = GA[lVar28].mapc;
      uVar21 = (uint)((double)lVar11 * GA[lVar28].scale[lVar13]);
      uVar15 = GA[lVar28].nblock[lVar13];
      uVar12 = (long)(int)uVar15 - 1;
      uVar29 = (ulong)uVar21;
      if (uVar15 == uVar21) {
        uVar29 = uVar12 & 0xffffffff;
      }
      iVar16 = (int)uVar29;
      if (lVar11 < pCVar4[lVar9 + iVar16]) {
        plVar23 = pCVar4 + lVar9 + uVar29;
        do {
          plVar23 = plVar23 + -1;
          if ((int)uVar29 < 1) goto LAB_00166909;
          uVar21 = (int)uVar29 - 1;
          uVar29 = (ulong)uVar21;
        } while (lVar11 < *plVar23);
      }
      else {
        uVar21 = iVar16 - 1;
        lVar10 = (long)iVar16;
        do {
          if ((long)uVar12 <= lVar10) goto LAB_00166909;
          uVar21 = uVar21 + 1;
          lVar24 = lVar10 + 1;
          lVar10 = lVar10 + 1;
        } while (pCVar4[lVar9 + lVar24] <= lVar11);
      }
      goto LAB_0016690c;
    }
    lVar9 = 0;
    lVar13 = 0;
LAB_001669d8:
    if (lVar13 == lVar20) {
      *np = 0;
      lVar9 = 1;
      for (lVar13 = 0; lVar20 != lVar13; lVar13 = lVar13 + 1) {
        lVar9 = lVar9 * ((procB[lVar13] - procT[lVar13]) + 1);
        proc_subscript[lVar13] = procT[lVar13];
      }
      uVar8 = 0;
      if (0 < (short)uVar2) {
        uVar8 = uVar2;
      }
      local_260 = 0;
      if (lVar9 < 1) {
        lVar9 = 0;
      }
      lVar13 = 0;
      do {
        if (lVar13 == lVar9) {
          return 1;
        }
        CVar14 = 0;
        lVar11 = 1;
        for (lVar10 = 0; lVar20 != lVar10; lVar10 = lVar10 + 1) {
          lVar24 = lVar11;
          if (lVar10 < lVar19 + -1) {
            lVar24 = pgVar7[g_a + 1000].nblock[lVar10] * lVar11;
          }
          CVar14 = CVar14 + lVar11 * proc_subscript[lVar10];
          lVar11 = lVar24;
        }
        if (pgVar7[lVar28].num_rstrctd == 0) {
          lVar11 = 1;
          for (lVar10 = 0; lVar20 != lVar10; lVar10 = lVar10 + 1) {
            lVar11 = lVar11 * pgVar7[lVar28].nblock[lVar10];
          }
          if ((CVar14 < 0) || (lVar11 <= CVar14)) {
            for (lVar11 = 0; lVar20 != lVar11; lVar11 = lVar11 + 1) {
              pcVar1 = err_string + lVar11 * 8;
              pcVar1[0] = '\0';
              pcVar1[1] = '\0';
              pcVar1[2] = '\0';
              pcVar1[3] = '\0';
              pcVar1[4] = '\0';
              pcVar1[5] = '\0';
              pcVar1[6] = '\0';
              pcVar1[7] = '\0';
              max[lVar11] = -1;
            }
          }
          else {
            lVar10 = 0;
            lVar11 = CVar14;
            for (lVar24 = 0; lVar20 != lVar24; lVar24 = lVar24 + 1) {
              lVar25 = (long)pgVar7[g_a + 1000].nblock[lVar24];
              lVar17 = lVar11 % lVar25;
              pCVar4 = pgVar7[lVar28].mapc;
              *(C_Integer *)(err_string + lVar24 * 8) = pCVar4[lVar17 + lVar10];
              if (lVar17 == lVar25 + -1) {
                CVar18 = pgVar7[g_a + 1000].dims[lVar24];
              }
              else {
                CVar18 = pCVar4[lVar17 + lVar10 + 1] + -1;
              }
              lVar10 = lVar10 + lVar25;
              max[lVar24] = CVar18;
              lVar11 = lVar11 / lVar25;
            }
          }
        }
        else if (CVar14 < pgVar7[lVar28].num_rstrctd) {
          lVar11 = 1;
          for (lVar10 = 0; lVar20 != lVar10; lVar10 = lVar10 + 1) {
            lVar11 = lVar11 * pgVar7[g_a + 1000].nblock[lVar10];
          }
          if ((CVar14 < 0) || (lVar11 <= CVar14)) {
            for (lVar11 = 0; lVar20 != lVar11; lVar11 = lVar11 + 1) {
              pcVar1 = err_string + lVar11 * 8;
              pcVar1[0] = '\0';
              pcVar1[1] = '\0';
              pcVar1[2] = '\0';
              pcVar1[3] = '\0';
              pcVar1[4] = '\0';
              pcVar1[5] = '\0';
              pcVar1[6] = '\0';
              pcVar1[7] = '\0';
              max[lVar11] = -1;
            }
          }
          else {
            lVar10 = 0;
            lVar11 = CVar14;
            for (lVar24 = 0; lVar20 != lVar24; lVar24 = lVar24 + 1) {
              lVar25 = (long)pgVar7[g_a + 1000].nblock[lVar24];
              lVar17 = lVar11 % lVar25;
              pCVar4 = pgVar7[lVar28].mapc;
              *(C_Integer *)(err_string + lVar24 * 8) = pCVar4[lVar17 + lVar10];
              if (lVar17 == lVar25 + -1) {
                CVar18 = pgVar7[g_a + 1000].dims[lVar24];
              }
              else {
                CVar18 = pCVar4[lVar17 + lVar10 + 1] + -1;
              }
              lVar10 = lVar10 + lVar25;
              max[lVar24] = CVar18;
              lVar11 = lVar11 / lVar25;
            }
          }
        }
        else {
          for (uVar12 = 0; uVar8 != uVar12; uVar12 = uVar12 + 1) {
            pcVar1 = err_string + uVar12 * 8;
            pcVar1[0] = '\0';
            pcVar1[1] = '\0';
            pcVar1[2] = '\0';
            pcVar1[3] = '\0';
            pcVar1[4] = '\0';
            pcVar1[5] = '\0';
            pcVar1[6] = '\0';
            pcVar1[7] = '\0';
            max[uVar12] = -1;
          }
        }
        local_260 = local_260 * lVar19 * 2;
        for (lVar11 = 0; lVar20 != lVar11; lVar11 = lVar11 + 1) {
          lVar10 = *(long *)(err_string + lVar11 * 8);
          if (*(long *)(err_string + lVar11 * 8) < lo[lVar11]) {
            lVar10 = lo[lVar11];
          }
          map[local_260 + lVar11] = lVar10;
        }
        for (lVar11 = 0; lVar20 != lVar11; lVar11 = lVar11 + 1) {
          lVar10 = max[lVar11];
          if (hi[lVar11] < max[lVar11]) {
            lVar10 = hi[lVar11];
          }
          map[lVar19 + local_260 + lVar11] = lVar10;
        }
        if (pgVar7[lVar28].num_rstrctd != 0) {
          CVar14 = pgVar7[lVar28].rstrctd_list[CVar14];
        }
        proclist[lVar13] = CVar14;
        for (lVar11 = 0; lVar20 != lVar11; lVar11 = lVar11 + 1) {
          if (proc_subscript[lVar11] < procB[lVar11]) {
            proc_subscript[lVar11] = proc_subscript[lVar11] + 1;
            break;
          }
          proc_subscript[lVar11] = procT[lVar11];
        }
        local_260 = *np + 1;
        *np = local_260;
        lVar13 = lVar13 + 1;
      } while( true );
    }
    lVar11 = hi[lVar13];
    pCVar4 = GA[lVar28].mapc;
    uVar21 = (uint)((double)lVar11 * GA[lVar28].scale[lVar13]);
    uVar15 = GA[lVar28].nblock[lVar13];
    uVar12 = (long)(int)uVar15 - 1;
    uVar29 = (ulong)uVar21;
    if (uVar15 == uVar21) {
      uVar29 = uVar12 & 0xffffffff;
    }
    iVar16 = (int)uVar29;
    if (lVar11 < pCVar4[lVar9 + iVar16]) {
      plVar23 = pCVar4 + lVar9 + uVar29;
      do {
        plVar23 = plVar23 + -1;
        if ((int)uVar29 < 1) goto LAB_00166a69;
        uVar21 = (int)uVar29 - 1;
        uVar29 = (ulong)uVar21;
      } while (lVar11 < *plVar23);
    }
    else {
      uVar21 = iVar16 - 1;
      lVar10 = (long)iVar16;
      do {
        if ((long)uVar12 <= lVar10) goto LAB_00166a69;
        uVar21 = uVar21 + 1;
        lVar24 = lVar10 + 1;
        lVar10 = lVar10 + 1;
      } while (pCVar4[lVar9 + lVar24] <= lVar11);
    }
    goto LAB_00166a6c;
  case 1:
    lVar13 = 0;
    lVar9 = GA[lVar28].block_total;
    if (GA[lVar28].block_total < 1) {
      lVar9 = 0;
    }
    bVar6 = true;
    for (proc = 0; proc != lVar9; proc = proc + 1) {
      pnga_distribution(g_a,proc,(Integer *)err_string,max);
      bVar5 = bVar6;
      for (lVar28 = 0; (bVar5 && (lVar28 < lVar19)); lVar28 = lVar28 + 1) {
        if (((*(long *)(err_string + lVar28 * 8) < lo[lVar28]) ||
            (bVar5 = bVar6, hi[lVar28] < *(long *)(err_string + lVar28 * 8))) &&
           ((max[lVar28] < lo[lVar28] || (bVar5 = bVar6, hi[lVar28] < max[lVar28])))) {
          bVar5 = false;
        }
      }
      if (bVar5) {
        proclist[lVar13] = proc;
        lVar13 = lVar13 + 1;
      }
    }
    *np = lVar13;
    lVar28 = 0;
    if (lVar13 < 1) {
      lVar13 = lVar28;
    }
    pIVar22 = map + lVar19;
    local_258 = map;
    for (; lVar28 != lVar13; lVar28 = lVar28 + 1) {
      pnga_distribution(g_a,proclist[lVar28],(Integer *)err_string,max);
      for (lVar9 = 0; lVar20 != lVar9; lVar9 = lVar9 + 1) {
        lVar11 = *(long *)(err_string + lVar9 * 8);
        if (*(long *)(err_string + lVar9 * 8) < lo[lVar9]) {
          lVar11 = lo[lVar9];
        }
        local_258[lVar9] = lVar11;
        lVar11 = max[lVar9];
        if (hi[lVar9] < max[lVar9]) {
          lVar11 = hi[lVar9];
        }
        pIVar22[lVar9] = lVar11;
      }
      pIVar22 = pIVar22 + lVar19 * 2;
      local_258 = local_258 + lVar19 * 2;
    }
    break;
  case 2:
  case 3:
    for (lVar28 = 0; lVar20 != lVar28; lVar28 = lVar28 + 1) {
      lVar9 = GA[g_a + 1000].block_dims[lVar28];
      lVar13 = (lo[lVar28] + -1) / lVar9;
      *(long *)(err_string + lVar28 * 8) = lVar13;
      max[lVar28] = (hi[lVar28] + -1) / lVar9;
      *(long *)(procT + lVar28 * 2) = lVar13;
    }
    lVar28 = max[lVar19 + -1];
    pIVar22 = map + lVar19;
    lVar9 = 0;
    while (*(long *)(proc_subscript + lVar19 * 2 + 6) <= lVar28) {
      lVar10 = 0;
      lVar13 = 1;
      for (lVar11 = lVar19 + -1; -1 < lVar11; lVar11 = lVar11 + -1) {
        lVar10 = lVar10 * lVar13 + *(long *)(procT + lVar11 * 2);
        lVar13 = lVar13 * GA[g_a + 1000].num_blocks[lVar11];
      }
      proclist[lVar9] = lVar10;
      for (lVar13 = 0; pgVar7 = GA, lVar20 != lVar13; lVar13 = lVar13 + 1) {
        lVar11 = *(long *)(procT + lVar13 * 2);
        map[lVar13] = GA[g_a + 1000].block_dims[lVar13] * lVar11 + 1;
        lVar10 = (lVar11 + 1) * pgVar7[g_a + 1000].block_dims[lVar13];
        pIVar22[lVar13] = lVar10;
        lVar11 = pgVar7[g_a + 1000].dims[lVar13];
        if (lVar11 <= lVar10) {
          lVar10 = lVar11;
        }
        pIVar22[lVar13] = lVar10;
      }
      lVar13 = procT._0_8_ + 1;
      procT._0_8_ = lVar13;
      lVar11 = 0;
      while ((lVar11 < lVar19 && (max[lVar11] < lVar13))) {
        if (lVar11 < lVar19 + -1) {
          *(undefined8 *)(procT + lVar11 * 2) = *(undefined8 *)(err_string + lVar11 * 8);
          lVar13 = *(long *)(procT + lVar11 * 2 + 2) + 1;
          *(long *)(procT + lVar11 * 2 + 2) = lVar13;
          lVar11 = lVar11 + 1;
        }
        else {
          lVar13 = *(long *)(procT + lVar11 * 2 + 2);
          lVar11 = lVar11 + 1;
        }
      }
      lVar9 = lVar9 + 1;
      pIVar22 = pIVar22 + lVar19 * 2;
      map = map + lVar19 * 2;
    }
    *np = lVar9;
    break;
  case 4:
    lVar9 = 0;
    for (lVar13 = 0; lVar13 != lVar20; lVar13 = lVar13 + 1) {
      pCVar4 = GA[lVar28].mapc;
      lVar11 = lo[lVar13];
      uVar15 = (uint)((double)lVar11 * GA[lVar28].scale[lVar13]);
      lVar10 = GA[lVar28].num_blocks[lVar13];
      uVar21 = (int)lVar10 - 1;
      if (lVar10 == (int)uVar15) {
        uVar15 = uVar21;
      }
      if (lVar11 < pCVar4[lVar9 + (int)uVar15]) {
        plVar23 = pCVar4 + lVar9 + (ulong)uVar15;
        do {
          plVar23 = plVar23 + -1;
          uVar27 = uVar21;
          if ((int)uVar15 < 1) break;
          uVar15 = uVar15 - 1;
          uVar27 = uVar15;
        } while (lVar11 < *plVar23);
      }
      else {
        uVar26 = uVar15 - 1;
        lVar24 = (long)(int)uVar15;
        do {
          uVar27 = uVar21;
          if (lVar10 + -1 <= lVar24) break;
          uVar26 = uVar26 + 1;
          lVar17 = lVar24 + 1;
          lVar24 = lVar24 + 1;
          uVar27 = uVar26;
        } while (pCVar4[lVar9 + lVar17] <= lVar11);
      }
      procT[lVar13] = uVar27;
      lVar9 = lVar9 + lVar10;
    }
    lVar9 = 0;
    for (lVar13 = 0; lVar13 != lVar20; lVar13 = lVar13 + 1) {
      pCVar4 = GA[lVar28].mapc;
      lVar11 = hi[lVar13];
      uVar15 = (uint)((double)lVar11 * GA[lVar28].scale[lVar13]);
      lVar10 = GA[lVar28].num_blocks[lVar13];
      uVar21 = (int)lVar10 - 1;
      if (lVar10 == (int)uVar15) {
        uVar15 = uVar21;
      }
      if (lVar11 < pCVar4[lVar9 + (int)uVar15]) {
        plVar23 = pCVar4 + lVar9 + (ulong)uVar15;
        do {
          plVar23 = plVar23 + -1;
          uVar27 = uVar21;
          if ((int)uVar15 < 1) break;
          uVar15 = uVar15 - 1;
          uVar27 = uVar15;
        } while (lVar11 < *plVar23);
      }
      else {
        uVar26 = uVar15 - 1;
        lVar24 = (long)(int)uVar15;
        do {
          uVar27 = uVar21;
          if (lVar10 + -1 <= lVar24) break;
          uVar26 = uVar26 + 1;
          lVar17 = lVar24 + 1;
          lVar24 = lVar24 + 1;
          uVar27 = uVar26;
        } while (pCVar4[lVar9 + lVar17] <= lVar11);
      }
      procB[lVar13] = uVar27;
      lVar9 = lVar9 + lVar10;
    }
    *np = 0;
    lVar9 = 1;
    for (lVar13 = 0; lVar20 != lVar13; lVar13 = lVar13 + 1) {
      lVar9 = lVar9 * ((procB[lVar13] - procT[lVar13]) + 1);
      proc_subscript[lVar13] = procT[lVar13];
    }
    uVar8 = 0;
    if (0 < (short)uVar2) {
      uVar8 = uVar2;
    }
    if (lVar9 < 1) {
      lVar9 = 0;
    }
    lVar13 = 0;
    do {
      if (lVar13 == lVar9) {
        return 1;
      }
      lVar24 = 0;
      lVar11 = 1;
      for (lVar10 = 0; lVar20 != lVar10; lVar10 = lVar10 + 1) {
        lVar17 = lVar11;
        if (lVar10 < lVar19 + -1) {
          lVar17 = pgVar7[g_a + 1000].num_blocks[lVar10] * lVar11;
        }
        lVar24 = lVar24 + lVar11 * proc_subscript[lVar10];
        lVar11 = lVar17;
      }
      proclist[lVar13] = lVar24;
      lVar10 = (long)(int)lVar24 % pgVar7[lVar28].num_blocks[0];
      _index[0] = (int)lVar10;
      lVar11 = 0;
      while (lVar11 + 1 < lVar19) {
        lVar24 = (long)((int)lVar24 - (int)lVar10) / pgVar7[g_a + 1000].num_blocks[lVar11];
        lVar10 = (long)(int)lVar24 % pgVar7[g_a + 1000].num_blocks[lVar11 + 1];
        _index[lVar11 + 1] = (int)lVar10;
        lVar11 = lVar11 + 1;
      }
      iVar16 = 0;
      for (lVar11 = 0; (ulong)uVar8 * 4 != lVar11; lVar11 = lVar11 + 4) {
        pCVar4 = pgVar7[lVar28].mapc;
        iVar3 = *(int *)((long)_index + lVar11);
        lVar24 = (long)iVar16 + (long)iVar3;
        *(C_Integer *)(err_string + lVar11 * 2) = pCVar4[lVar24];
        lVar10 = *(long *)((long)pgVar7[lVar28].num_blocks + lVar11 * 2);
        if ((long)iVar3 < lVar10 + -1) {
          lVar24 = pCVar4[lVar24 + 1] + -1;
        }
        else {
          lVar24 = *(long *)((long)pgVar7[lVar28].dims + lVar11 * 2);
        }
        *(long *)((long)max + lVar11 * 2) = lVar24;
        iVar16 = iVar16 + (int)lVar10;
      }
      lVar11 = *np * lVar19 * 2;
      for (lVar10 = 0; lVar20 != lVar10; lVar10 = lVar10 + 1) {
        lVar24 = *(long *)(err_string + lVar10 * 8);
        if (*(long *)(err_string + lVar10 * 8) < lo[lVar10]) {
          lVar24 = lo[lVar10];
        }
        map[lVar11 + lVar10] = lVar24;
      }
      for (lVar10 = 0; lVar20 != lVar10; lVar10 = lVar10 + 1) {
        lVar24 = max[lVar10];
        if (hi[lVar10] < max[lVar10]) {
          lVar24 = hi[lVar10];
        }
        map[lVar19 + lVar11 + lVar10] = lVar24;
      }
      for (lVar11 = 0; lVar20 != lVar11; lVar11 = lVar11 + 1) {
        if (proc_subscript[lVar11] < procB[lVar11]) {
          proc_subscript[lVar11] = proc_subscript[lVar11] + 1;
          break;
        }
        proc_subscript[lVar11] = procT[lVar11];
      }
      *np = *np + 1;
      lVar13 = lVar13 + 1;
    } while( true );
  }
  return 1;
LAB_00166909:
  uVar21 = (uint)uVar12;
LAB_0016690c:
  procT[lVar13] = uVar21;
  lVar9 = lVar9 + (int)uVar15;
  lVar13 = lVar13 + 1;
  goto LAB_00166877;
LAB_00166a69:
  uVar21 = (uint)uVar12;
LAB_00166a6c:
  procB[lVar13] = uVar21;
  lVar9 = lVar9 + (int)uVar15;
  lVar13 = lVar13 + 1;
  goto LAB_001669d8;
}

Assistant:

logical pnga_locate_region( Integer g_a,
                            Integer *lo,
                            Integer *hi,
                            Integer *map,
                            Integer *proclist,
                            Integer *np)
/*    g_a      [input]  global array handle
      lo       [input]  lower indices of patch in global array
      hi       [input]  upper indices of patch in global array
      map      [output] list of lower and upper indices for portion of
                        patch that exists on each processor containing a
                        portion of the patch. The map is constructed so
                        that for a D dimensional global array, the first
                        D elements are the lower indices on the first
                        processor in proclist, the next D elements are
                        the upper indices of the first processor in
                        proclist, the next D elements are the lower
                        indices for the second processor in proclist, and
                        so on.
      proclist [output] list of processors containing some portion of the
                        patch
      np       [output] total number of processors containing a portion
                        of the patch

      For a block cyclic data distribution, this function returns a list of
      blocks that cover the region along with the lower and upper indices of
      each block.
*/
{
  int  procT[MAXDIM], procB[MAXDIM], proc_subscript[MAXDIM];
  Integer  proc, owner, i, ga_handle;
  Integer  d, dpos, ndim, elems, use_blocks;
  /* Integer  p_handle; */

  ga_check_handleM(g_a, "nga_locate_region");

  ga_handle = GA_OFFSET + g_a;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))return FALSE;

  ndim = GA[ga_handle].ndim;

  if (GA[ga_handle].distr_type == REGULAR) {
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].nblock);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];
      Integer  offset;

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].nblock); 
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      offset = *np *(ndim*2); /* location in map to put patch range */

      for(d = 0; d< ndim; d++)
        map[d + offset ] = lo[d] < _lo[d] ? _lo[d] : lo[d];

      for(d = 0; d< ndim; d++)
        map[ndim + d + offset ] = hi[d] > _hi[d] ? _hi[d] : hi[d];

      owner = proc;
      if (GA[ga_handle].num_rstrctd == 0) {
        proclist[i] = owner;
      } else {
        proclist[i] = GA[ga_handle].rstrctd_list[owner];
      }
      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].nblock);
      (*np)++;
    }
  } else if (GA[ga_handle].distr_type == TILED_IRREG) {
    Integer nproc = pnga_pgroup_nnodes(GA[ga_handle].p_handle);
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */
    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].num_blocks[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].num_blocks[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].num_blocks[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].num_blocks[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].num_blocks);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];
      Integer  offset;

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].num_blocks); 
      proclist[i] = proc;
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      offset = *np *(ndim*2); /* location in map to put patch range */


      for(d = 0; d< ndim; d++)
        map[d + offset ] = lo[d] < _lo[d] ? _lo[d] : lo[d];

      for(d = 0; d< ndim; d++)
        map[ndim + d + offset ] = hi[d] > _hi[d] ? _hi[d] : hi[d];

      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].num_blocks);
      (*np)++;
    }
  } else if (GA[ga_handle].distr_type == BLOCK_CYCLIC) {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, j, tlo[MAXDIM], thi[MAXDIM], cnt;
    Integer offset;
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }
      /* store blocks that overlap request region in proclist */
      if (chk) {
        proclist[cnt] = i;
        cnt++;
      }
    }
    *np = cnt;

    /* fill map array with block coordinates */
    for (i=0; i<cnt; i++) {
      offset = i*2*ndim;
      j = proclist[i];
      pnga_distribution(g_a,j,tlo,thi);
      for (j=0; j<ndim; j++) {
        map[offset + j] = lo[j] < tlo[j] ? tlo[j] : lo[j];
        map[offset + ndim + j] = hi[j] > thi[j] ? thi[j] : hi[j];
      }
    }
  } else if (GA[ga_handle].distr_type == SCALAPACK ||
             GA[ga_handle].distr_type == TILED) {
    /* find min and max block coordinates of region */
    Integer min[MAXDIM], max[MAXDIM];
    Integer count[MAXDIM];
    Integer total_blocks = 1;
    Integer cnt = 0;
    Integer offset;
    for (i=0; i<ndim; i++) {
      min[i] = (lo[i]-1)/GA[ga_handle].block_dims[i];
      max[i] = (hi[i]-1)/GA[ga_handle].block_dims[i];
      total_blocks *= (max[i]-min[i]+1);
      count[i] = min[i];
    }
    while (count[ndim-1]<=max[ndim-1]) {
      /* Calculate block index */
      Integer idx = 0;
      Integer factor = 1;
      Integer iproc;
      Integer p_handle = GA[ga_handle].p_handle;
      Integer size = pnga_pgroup_nnodes(p_handle);
      for (i=ndim-1; i>=0; i--) {
        idx = idx*factor+count[i];
        factor *= GA[ga_handle].num_blocks[i];
      }
      proclist[cnt] = idx;
      /* store information on this block */
      offset = 2*cnt*ndim;
      for (i=0; i<ndim; i++) {
        map[offset+i] = count[i]*GA[ga_handle].block_dims[i]+1;
        map[offset+ndim+i] = (count[i]+1)*GA[ga_handle].block_dims[i];
        if (map[offset+ndim+i] > GA[ga_handle].dims[i])
          map[offset+ndim+i] = GA[ga_handle].dims[i];
      }
      cnt++;
      /* Increment count array */
      i = 0;
      count[0]++;
      while (count[i] > max[i] && i<ndim) {
        if (i<ndim-1) count[i] = min[i];
        if (i<ndim-1) {
          count[i+1]++;
        }
        i++;
      }
    }
    *np = cnt;
  }
  return(TRUE);
}